

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

Fl_Menu_Item * __thiscall Fl_Menu_::picked(Fl_Menu_ *this,Fl_Menu_Item *v)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  
  if (v == (Fl_Menu_Item *)0x0) {
    return (Fl_Menu_Item *)0x0;
  }
  uVar3 = v->flags;
  if ((uVar3 & 8) == 0) {
    if ((uVar3 & 2) == 0) {
      if (this->value_ != v) {
        puVar1 = &(this->super_Fl_Widget).flags_;
        *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      }
      goto LAB_001c0089;
    }
    puVar1 = &(this->super_Fl_Widget).flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    v->flags = uVar3 ^ 4;
  }
  else if ((uVar3 & 4) == 0) {
    puVar1 = &(this->super_Fl_Widget).flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    setonly(this,v);
  }
  Fl_Widget::redraw(&this->super_Fl_Widget);
LAB_001c0089:
  this->value_ = v;
  bVar2 = (this->super_Fl_Widget).when_;
  if (((bVar2 & 5) != 0) && ((bVar2 & 2) != 0 || ((this->super_Fl_Widget).flags_ & 0x80) != 0)) {
    if (v->callback_ == (Fl_Callback *)0x0) {
      Fl_Widget::do_callback
                (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_);
    }
    else {
      (*v->callback_)(&this->super_Fl_Widget,v->user_data_);
    }
  }
  return v;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_::picked(const Fl_Menu_Item* v) {
  if (v) {
    if (v->radio()) {
      if (!v->value()) { // they are turning on a radio item
        set_changed();
        setonly((Fl_Menu_Item*)v);
      }
      redraw();
    } else if (v->flags & FL_MENU_TOGGLE) {
      set_changed();
      ((Fl_Menu_Item*)v)->flags ^= FL_MENU_VALUE;
      redraw();
    } else if (v != value_) { // normal item
      set_changed();
    }
    value_ = v;
    if (when()&(FL_WHEN_CHANGED|FL_WHEN_RELEASE)) {
      if (changed() || when()&FL_WHEN_NOT_CHANGED) {
	if (value_ && value_->callback_) value_->do_callback((Fl_Widget*)this);
	else do_callback();
      }
    }
  }
  return v;
}